

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runtime.hpp
# Opt level: O0

void __thiscall cs::domain_manager::mark_set_as_struct(domain_manager *this,bool inherited)

{
  byte bVar1;
  byte in_SIL;
  allocator local_69;
  string local_68 [55];
  allocator local_31;
  string local_30 [24];
  string *in_stack_ffffffffffffffe8;
  undefined7 in_stack_fffffffffffffff0;
  
  bVar1 = in_SIL & 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_30,"__PRAGMA_CS_STRUCT_DEFINITION__",&local_31);
  add_record((domain_manager *)CONCAT17(bVar1,in_stack_fffffffffffffff0),in_stack_ffffffffffffffe8);
  std::__cxx11::string::~string(local_30);
  std::allocator<char>::~allocator((allocator<char> *)&local_31);
  if ((bVar1 & 1) != 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_68,"parent",&local_69);
    add_record((domain_manager *)CONCAT17(bVar1,in_stack_fffffffffffffff0),in_stack_ffffffffffffffe8
              );
    std::__cxx11::string::~string(local_68);
    std::allocator<char>::~allocator((allocator<char> *)&local_69);
  }
  return;
}

Assistant:

void mark_set_as_struct(bool inherited = false)
		{
			add_record("__PRAGMA_CS_STRUCT_DEFINITION__");
			if (inherited)
				add_record("parent");
		}